

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O1

void __thiscall
TPZFileEqnStorage<std::complex<float>_>::ReOpen(TPZFileEqnStorage<std::complex<float>_> *this)

{
  FILE *__stream;
  
  __stream = fopen((this->fFileName)._M_dataplus._M_p,"rb");
  this->fIOStream = (FILE *)__stream;
  fread(&this->fNumHeaders,4,1,__stream);
  fread(&this->fNumBlocks,4,1,(FILE *)this->fIOStream);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::ReOpen()
{
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) LOGPZ_DEBUG(logger,"reopening the file")
#endif
	fIOStream = fopen(fFileName.c_str(),"rb"); //open for reading
	/**
	 *Opens binary files and get initial information
	 *use this information for storage requirements
	 */
	int64_t sizereturn;
	sizereturn = 0;
	sizereturn = fread(&fNumHeaders,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
	sizereturn = fread(&fNumBlocks,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
	if (sizereturn != 1) DebugStop();
#endif
}